

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O1

bool __thiscall
cmDyndepCollation::WriteDyndepMetadata
          (cmDyndepCollation *this,string *lang,
          vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *objects,
          cmCxxModuleExportInfo *export_info,cmDyndepMetadataCallbacks *cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  _Base_ptr __s1;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  _Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> this_00;
  ostream *poVar11;
  cmGeneratedFileStream *this_01;
  const_iterator cVar12;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_02;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar13;
  const_iterator cVar14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  string *extraout_RDX;
  string *psVar17;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  string *extraout_RDX_07;
  string *extraout_RDX_08;
  string *extraout_RDX_09;
  string *extraout_RDX_10;
  string *extraout_RDX_11;
  string *extraout_RDX_12;
  string *extraout_RDX_13;
  string *extraout_RDX_14;
  string *extraout_RDX_15;
  string *extraout_RDX_16;
  string *extraout_RDX_17;
  string *extraout_RDX_18;
  byte bVar18;
  cmSourceReqInfo *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  size_t *psVar20;
  long *plVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  WrapQuotes wrapQuotes;
  size_type __rlen;
  value_type *provides;
  pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
  *exp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar26;
  string output_path;
  string bmi_path;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> properties;
  string iface_source;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dest_1;
  string build_bmi_path;
  string bmi_destination;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  exports;
  string install_bmi_path;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  private_modules;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  public_source_requires;
  string config_upper;
  undefined1 local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  undefined8 local_348;
  string *local_338;
  key_type local_330;
  undefined1 local_310 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  string *local_2e8;
  _Base_ptr local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  string *local_2d0;
  _Base_ptr local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  pointer local_2b0;
  pointer local_2a8;
  undefined8 local_2a0;
  _Base_ptr local_298;
  _Base_ptr local_290;
  undefined8 local_288;
  undefined8 local_280;
  char *local_278;
  undefined8 local_270;
  undefined1 local_268 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  long *local_240;
  string local_238;
  undefined4 local_214;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined1 local_170 [8];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  _Base_ptr local_150;
  size_t local_148;
  undefined1 local_138 [24];
  _Rb_tree_node_base *local_120;
  _Rb_tree_node_base *local_118;
  undefined8 local_110;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer *local_a8;
  _Base_ptr local_a0;
  long *local_98;
  size_t *local_90;
  cmCxxModuleExportInfo *local_88;
  _Base_ptr *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  wrapQuotes = (WrapQuotes)cb;
  bVar18 = 1;
  if ((*(long *)(this + 8) == 3) &&
     (local_88 = export_info, iVar10 = bcmp(*(void **)this,"CXX",3), iVar10 == 0)) {
    local_338 = lang;
    cmsys::SystemTools::UpperCase
              (&local_70,
               (string *)
               &objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    local_1a8._M_allocated_capacity = 0;
    local_1a8._8_8_ = (undefined8 *)0x0;
    local_198 = 0;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (paVar25 != paVar24) {
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_370 + 0x18);
      do {
        local_268._0_8_ =
             (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)
             0x0;
        local_310._8_8_ = *(undefined8 *)(paVar25->_M_local_buf + 0x40);
        local_310._0_8_ = *(undefined8 *)(paVar25->_M_local_buf + 0x48);
        local_310._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_370._0_8_ = (pointer)0x0;
        local_370._8_8_ = &DAT_00000001;
        local_370[0x18] = '/';
        local_310._24_8_ = 1;
        local_2e8 = (string *)0x0;
        local_2d8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(paVar25->_M_local_buf + 0x60);
        local_2e0 = (_Base_ptr)
                    (((pointer)(paVar25->_M_local_buf + 0x68))->PrimaryOutput)._M_dataplus._M_p;
        local_2d0 = (string *)0x0;
        local_170 = (undefined1  [8])0x0;
        local_168._0_8_ = &DAT_00000001;
        local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158;
        local_158[0] = 0x2f;
        local_2c8 = (_Base_ptr)&DAT_00000001;
        local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        views._M_len = 4;
        views._M_array = (iterator)local_310;
        local_370._16_8_ = paVar1;
        local_2f0 = paVar1;
        local_168._8_8_ = local_2c0;
        cmCatViews((string *)(local_158 + 0x20),views);
        local_310._0_8_ = CONCAT44(local_138._12_4_,local_138._8_4_);
        local_310._8_8_ = local_138._0_8_;
        local_310._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_310._24_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x7;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x8e7e05;
        local_2e8 = (string *)0x0;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)paVar25->_M_allocated_capacity;
        local_2e0 = *(_Base_ptr *)((long)paVar25 + 8);
        local_2d0 = (string *)0x0;
        local_370._0_8_ = (char *)0x0;
        local_370._8_8_ = &DAT_00000001;
        local_370[0x18] = 0x2d;
        local_2c8 = (_Base_ptr)&DAT_00000001;
        local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_2a8 = objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        local_2b0 = objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2a0 = 0;
        local_298 = (_Base_ptr)0x6;
        local_290 = (_Base_ptr)0x8c642f;
        local_288 = 0;
        views_00._M_len = 6;
        views_00._M_array = (iterator)local_310;
        local_370._16_8_ = paVar1;
        local_2c0 = paVar1;
        cmCatViews((string *)local_170,views_00);
        this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
             (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)
                   this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                   (string *)local_170,false,None);
        if ((cmGeneratedFileStream *)local_268._0_8_ != (cmGeneratedFileStream *)0x0) {
          lVar2 = *(long *)local_268._0_8_;
          local_268._0_8_ =
               this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          (**(code **)(lVar2 + 8))();
          this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
               (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)
               (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)local_268._0_8_;
        }
        local_268._0_8_ = this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl
        ;
        uVar7 = local_268._0_8_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_268._0_8_,"set_property(TARGET \"",0x15);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)uVar7,*(char **)(paVar25->_M_local_buf + 0x80),
                             (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)(paVar25->_M_local_buf + 0x88))->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)paVar25->_M_allocated_capacity,
                             (long)*(_Base_ptr *)((long)paVar25 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"  PROPERTY IMPORTED_CXX_MODULES_",0x20);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_70._M_dataplus._M_p,local_70._M_string_length);
        local_310[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_310,1);
        local_310._0_8_ = paVar25;
        std::
        vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
        ::
        emplace_back<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>
                  ((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
                    *)local_1a8._M_local_buf,
                   (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *
                   )local_268,(CxxModuleExport **)local_310);
        if (local_170 != (undefined1  [8])(local_168 + 8)) {
          operator_delete((void *)local_170,(ulong)(local_168._8_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if ((cmGeneratedFileStream *)local_268._0_8_ != (cmGeneratedFileStream *)0x0) {
          (*(((ofstream *)local_268._0_8_)->super_basic_ostream<char,_std::char_traits<char>_>).
            _vptr_basic_ostream[1])();
        }
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar25->_M_local_buf + 0xa8);
      } while (paVar25 != paVar24);
    }
    if (*(char *)&objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      this_01 = (cmGeneratedFileStream *)0x0;
      psVar17 = local_338;
    }
    else {
      this_01 = (cmGeneratedFileStream *)operator_new(0x268);
      psVar17 = local_338;
      cmGeneratedFileStream::cmGeneratedFileStream
                (this_01,(string *)
                         &objects[7].
                          super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,false,None);
    }
    local_158 = (undefined1  [8])local_168;
    local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
    local_168._8_8_ = 0;
    local_148 = 0;
    local_120 = (_Rb_tree_node_base *)(local_138 + 8);
    local_138._8_4_ = 0;
    local_138._16_8_ = 0;
    local_110 = 0;
    plVar21 = (long *)(psVar17->_M_dataplus)._M_p;
    local_98 = (long *)psVar17->_M_string_length;
    local_150 = (_Base_ptr)local_158;
    local_118 = local_120;
    if (plVar21 == local_98) {
      local_338 = (string *)CONCAT44(local_338._4_4_,(int)CONCAT71((int7)((ulong)local_98 >> 8),1));
      uVar7 = local_1a8._M_allocated_capacity;
      uVar22 = local_1a8._8_8_;
      p_Var16 = local_120;
    }
    else {
      local_a0 = (_Base_ptr)
                 &(objects->super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      local_a8 = &objects[3].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_310 + 0x10);
      local_338 = (string *)CONCAT44(local_338._4_4_,(int)CONCAT71((int7)((ulong)local_a8 >> 8),1));
      do {
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,*plVar21,plVar21[1] + *plVar21);
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                         *)objects,&local_330);
        plVar3 = (long *)plVar21[7];
        plVar4 = (long *)plVar21[8];
        local_240 = plVar21;
        if (cVar12._M_node == local_a0) {
          if (plVar3 != plVar4) {
            local_310._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x7;
            local_310._8_8_ = "Output ";
            local_310._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar21;
            local_310._24_8_ = plVar21[1];
            local_2e8 = (string *)0x0;
            local_2e0 = (_Base_ptr)0xf;
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x8e6f8b;
            local_2d0 = (string *)0x0;
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar3;
            local_2c8 = (_Base_ptr)plVar3[1];
            local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_2b0 = (pointer)0x42;
            local_2a8 = (pointer)0x8e6f9b;
            local_2a0 = 0;
            views_02._M_len = 5;
            views_02._M_array = (iterator)local_310;
            cmCatViews((string *)local_370,views_02);
            cmSystemTools::Error((string *)local_370);
            goto LAB_00501d88;
          }
        }
        else {
          __s1 = cVar12._M_node[5]._M_parent;
          p_Var5 = cVar12._M_node[5]._M_left;
          if (p_Var5 == (_Base_ptr)0x12) {
            iVar10 = bcmp(__s1,"CXX_MODULE_HEADERS",0x12);
            if (iVar10 == 0) goto LAB_00501ded;
          }
          else if ((p_Var5 == (_Base_ptr)0xb) &&
                  (iVar10 = bcmp(__s1,"CXX_MODULES",0xb), plVar21 = local_240, iVar10 == 0)) {
            if (plVar3 == plVar4) {
              local_310._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x7;
              local_310._8_8_ = "Output ";
              local_310._16_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*local_240;
              local_310._24_8_ = local_240[1];
              local_2e8 = (string *)0x0;
              local_2e0 = (_Base_ptr)0x53;
              local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x8e6fde;
              local_2d0 = (string *)0x0;
              views_06._M_len = 3;
              views_06._M_array = (iterator)local_310;
              cmCatViews((string *)local_370,views_06);
              cmSystemTools::Error((string *)local_370);
              goto LAB_00501d88;
            }
LAB_00501ded:
            bVar9 = cmFileSetVisibilityIsForInterface
                              (*(cmFileSetVisibility *)&cVar12._M_node[6]._M_parent);
            plVar21 = local_240;
            if (bVar9) {
              local_78 = (string *)&cVar12._M_node[4]._M_parent;
              this_02 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                         *)(local_158 + 0x20),local_78);
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       plVar21[0xb];
              psVar17 = extraout_RDX;
              for (pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             plVar21[10]; pbVar19 != pbVar6;
                  pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pbVar19[3]._M_string_length) {
                pVar26 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string_const&>(this_02,pbVar19);
                psVar17 = pVar26._8_8_;
              }
              psVar20 = (size_t *)plVar21[7];
              local_90 = (size_t *)plVar21[8];
              if (psVar20 != local_90) {
                local_80 = &cVar12._M_node[6]._M_left;
                do {
                  local_1c8 = &local_1b8;
                  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                  local_1b8._M_local_buf[0] = '\0';
                  if (*(char *)&objects[9].
                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start == '\x01') {
                    ppVar13 = WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                              ::$_1::operator()::string_const___const
                                        ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_268,local_a8,psVar17);
                    local_214 = (undefined4)CONCAT71((int7)((ulong)ppVar13 >> 8),local_268[0]);
                    local_370._0_8_ = local_268._16_8_;
                    local_370._8_8_ = local_268._8_8_;
                    local_370._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_310._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_310._8_8_ = &DAT_00000001;
                    local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_310 + 0x18);
                    local_310[0x18] = 0x2f;
                    local_370._24_8_ = 1;
                    local_348 = 0;
                    views_03._M_len = 2;
                    views_03._M_array = (iterator)local_370;
                    local_310._16_8_ = local_350;
                    cmCatViews((string *)local_210,views_03);
                    std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_210);
                    if ((undefined1 *)CONCAT71(local_210._1_7_,local_210[0]) != local_210 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_210._1_7_,local_210[0]),
                                      (ulong)(local_210._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_268._8_8_ != &local_250) {
                      operator_delete((void *)local_268._8_8_,local_250._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    local_214 = 0;
                  }
                  local_190 = &local_180;
                  local_188 = 0;
                  local_180 = 0;
                  local_1e8 = &local_1d8;
                  local_1e0 = 0;
                  local_1d8 = 0;
                  if ((local_88->ObjectToFileSet)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent == (_Base_ptr)0x0) {
                    std::__throw_bad_function_call();
                  }
                  (*(code *)(local_88->ObjectToFileSet)._M_t._M_impl.super__Rb_tree_header._M_header
                            ._M_left)(local_268,local_88,psVar20);
                  psVar17 = extraout_RDX_00;
                  uVar22 = local_1a8._M_allocated_capacity;
                  uVar7 = local_1a8._8_8_;
                  if (local_250._M_local_buf[8] == '\x01') {
                    cmsys::SystemTools::GetFilenameName(&local_238,(string *)local_268);
                    str._M_str = &DAT_00000001;
                    str._M_len = (size_t)local_238._M_dataplus._M_p;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)local_210,(cmOutputConverter *)local_238._M_string_length,
                               str,wrapQuotes);
                    local_310._0_8_ = local_1c0;
                    local_310._8_8_ = local_1c8;
                    local_310._16_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_210._1_7_,local_210[0]);
                    local_310._24_8_ = local_210._8_8_;
                    views_04._M_len = 2;
                    views_04._M_array = (iterator)local_310;
                    local_2e8 = (string *)local_210;
                    cmCatViews((string *)local_370,views_04);
                    std::__cxx11::string::operator=((string *)&local_190,(string *)local_370);
                    if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                      operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
                    }
                    if ((undefined1 *)CONCAT71(local_210._1_7_,local_210[0]) != local_210 + 0x10) {
                      operator_delete((undefined1 *)CONCAT71(local_210._1_7_,local_210[0]),
                                      (ulong)(local_210._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                               local_238.field_2._M_local_buf[0]) + 1);
                    }
                    str_00._M_str = &DAT_00000001;
                    str_00._M_len = local_268._0_8_;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)local_310,(cmOutputConverter *)local_268._8_8_,str_00,
                               wrapQuotes);
                    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_310);
                    psVar17 = extraout_RDX_01;
                    uVar22 = local_1a8._M_allocated_capacity;
                    uVar7 = local_1a8._8_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._0_8_ != paVar25) {
                      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
                      psVar17 = extraout_RDX_02;
                      uVar22 = local_1a8._M_allocated_capacity;
                      uVar7 = local_1a8._8_8_;
                    }
                  }
                  for (; uVar8 = local_214, plVar21 = local_240, uVar22 != uVar7;
                      uVar22 = (undefined8 *)(uVar22 + 0x10)) {
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                    local_238._M_string_length = 0;
                    local_238.field_2._M_local_buf[0] = '\0';
                    if ((*(char *)(*(undefined8 *)(uVar22 + 8) + 0xa0) == '\x01') &&
                       (*(char *)&cVar12._M_node[7]._M_left == '\x01')) {
                      WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                      ::$_1::operator()::string_const___const
                                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_210,local_80,psVar17);
                      str_01._M_str = &DAT_00000001;
                      str_01._M_len = (size_t)cVar12._M_node[3]._M_parent;
                      cmOutputConverter::EscapeForCMake_abi_cxx11_
                                (&local_108,(cmOutputConverter *)cVar12._M_node[3]._M_left,str_01,
                                 wrapQuotes);
                      cmsys::SystemTools::GetFilenameName((string *)&local_e8,local_78);
                      str_02._M_str = &DAT_00000001;
                      str_02._M_len = local_e8._M_allocated_capacity;
                      cmOutputConverter::EscapeForCMake_abi_cxx11_
                                ((string *)&local_c8,(cmOutputConverter *)local_e8._8_8_,str_02,
                                 wrapQuotes);
                      local_310._0_8_ = local_210._16_8_;
                      local_310._8_8_ = local_210._8_8_;
                      local_310._16_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_370._0_8_ = (char *)0x0;
                      local_370._8_8_ = &DAT_00000001;
                      local_370._16_8_ = local_370 + 0x18;
                      local_370[0x18] = 0x2f;
                      local_310._24_8_ = &DAT_00000001;
                      local_2e8 = (string *)0x0;
                      local_2e0 = (_Base_ptr)local_108._M_string_length;
                      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_108._M_dataplus._M_p;
                      local_2d0 = &local_108;
                      local_2c8 = (_Base_ptr)local_c8._8_8_;
                      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_c8._M_allocated_capacity;
                      views_05._M_len = 4;
                      views_05._M_array = (iterator)local_310;
                      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_370._16_8_;
                      local_2b8 = &local_c8;
                      cmCatViews(&local_50,views_05);
                      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_50);
                      psVar17 = extraout_RDX_03;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                        psVar17 = extraout_RDX_04;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c8._M_allocated_capacity != &local_b8) {
                        operator_delete((void *)local_c8._M_allocated_capacity,
                                        local_b8._M_allocated_capacity + 1);
                        psVar17 = extraout_RDX_05;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_allocated_capacity != &local_d8) {
                        operator_delete((void *)local_e8._M_allocated_capacity,
                                        local_d8._M_allocated_capacity + 1);
                        psVar17 = extraout_RDX_06;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108._M_dataplus._M_p != &local_108.field_2) {
                        operator_delete(local_108._M_dataplus._M_p,
                                        local_108.field_2._M_allocated_capacity + 1);
                        psVar17 = extraout_RDX_07;
                      }
                      uVar23 = local_1f8._0_8_;
                      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_210._8_8_;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_210._8_8_ != &local_1f8) {
LAB_00502438:
                        operator_delete(paVar24,(ulong)((long)&(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar23)->_M_dataplus)._M_p + 1));
                        psVar17 = extraout_RDX_09;
                      }
                    }
                    else {
                      str_03._M_str = &DAT_00000001;
                      str_03._M_len = (size_t)cVar12._M_node[4]._M_parent;
                      cmOutputConverter::EscapeForCMake_abi_cxx11_
                                ((string *)local_310,(cmOutputConverter *)cVar12._M_node[4]._M_left,
                                 str_03,wrapQuotes);
                      std::__cxx11::string::operator=((string *)&local_238,(string *)local_310);
                      psVar17 = extraout_RDX_08;
                      uVar23 = local_310._16_8_;
                      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_310._0_8_;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._0_8_ != paVar25) goto LAB_00502438;
                    }
                    local_310._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_310._16_8_ = local_310._16_8_ & 0xffffffffffffff00;
                    local_310._0_8_ = paVar25;
                    if ((*(char *)(*(undefined8 *)(uVar22 + 8) + 0xa0) != '\x01') ||
                       (*(char *)&objects[9].
                                  super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                  _M_impl.super__Vector_impl_data._M_start != '\0')) {
                      std::__cxx11::string::_M_assign((string *)local_310);
                      psVar17 = extraout_RDX_10;
                    }
                    if ((cmOutputConverter *)local_238._M_string_length != (cmOutputConverter *)0x0)
                    {
                      poVar11 = *(ostream **)uVar22;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    \"",5);
                      str_04._M_str = &DAT_00000001;
                      str_04._M_len = *psVar20;
                      cmOutputConverter::EscapeForCMake_abi_cxx11_
                                ((string *)local_370,(cmOutputConverter *)psVar20[1],str_04,
                                 wrapQuotes);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,(char *)local_370._0_8_,local_370._8_8_);
                      local_210[0] = 0x3d;
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,local_210,1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_238._M_dataplus._M_p,local_238._M_string_length);
                      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                        operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._8_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        local_370[0] = 0x2c;
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            (*(ostream **)uVar22,local_370,1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)local_310._0_8_,local_310._8_8_);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                (*(ostream **)uVar22,"\"\n",2);
                      psVar17 = extraout_RDX_11;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._0_8_ != paVar25) {
                      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
                      psVar17 = extraout_RDX_12;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                               local_238.field_2._M_local_buf[0]) + 1);
                      psVar17 = extraout_RDX_13;
                    }
                  }
                  if (this_01 != (cmGeneratedFileStream *)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"if (CMAKE_INSTALL_COMPONENT STREQUAL \"",0x26);
                    str_05._M_str = &DAT_00000001;
                    str_05._M_len =
                         (size_t)objects[2].
                                 super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)local_310,
                               (cmOutputConverter *)
                               objects[2].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_finish,str_05,wrapQuotes);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)this_01,(char *)local_310._0_8_,local_310._8_8_)
                    ;
                    local_370[0] = 0x22;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_370,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._0_8_ != paVar25) {
                      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
                    }
                    if (*(char *)&objects[4].
                                  super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01," OR NOT CMAKE_INSTALL_COMPONENT",0x1f);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")\n",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"  file(INSTALL\n    DESTINATION \"",0x20);
                    if ((char)uVar8 == '\0') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01,"${CMAKE_INSTALL_PREFIX}/",0x18);
                    }
                    str_06._M_str = &DAT_00000001;
                    str_06._M_len =
                         (size_t)objects[3].
                                 super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)local_310,
                               (cmOutputConverter *)
                               objects[3].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,str_06,wrapQuotes);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)this_01,(char *)local_310._0_8_,local_310._8_8_)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"\"\n    TYPE FILE\n",0x10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._0_8_ != paVar25) {
                      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
                    }
                    if (*(char *)((long)&objects[4].
                                         super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) ==
                        '\x01') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01,"    OPTIONAL\n",0xd);
                    }
                    if (objects[6].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01,"    ",4);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)this_01,
                                           (char *)objects[6].
                                                                                                      
                                                  super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                           (long)objects[6].
                                                 super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                      ;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
                    if (objects[5].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01,"    PERMISSIONS",0xf);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)this_01,
                                           (char *)objects[5].
                                                                                                      
                                                  super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           (long)objects[5].
                                                 super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"    FILES \"",0xb);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)this_01,(char *)local_268._0_8_,local_268._8_8_)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\")\n",3);
                    if ((char)uVar8 != '\0') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_01,
                                 "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n    \"",0x34);
                      cmsys::SystemTools::GetFilenameName((string *)local_370,(string *)local_268);
                      str_07._M_str = &DAT_00000001;
                      str_07._M_len = local_370._0_8_;
                      cmOutputConverter::EscapeForCMake_abi_cxx11_
                                ((string *)local_310,(cmOutputConverter *)local_370._8_8_,str_07,
                                 wrapQuotes);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)this_01,(char *)local_310._0_8_,
                                           local_310._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,
                                 "\")\n  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(WARNING\n      \"ABSOLUTE path INSTALL DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(FATAL_ERROR\n      \"ABSOLUTE path INSTALL DESTINATION forbidden (by caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n"
                                 ,0x161);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._0_8_ != paVar25) {
                        operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
                      }
                      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                        operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
                      }
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"endif ()\n",9);
                    psVar17 = extraout_RDX_14;
                  }
                  if ((local_250._M_local_buf[8] == '\x01') &&
                     (local_250._M_local_buf[8] = '\0',
                     (cmGeneratedFileStream *)local_268._0_8_ !=
                     (cmGeneratedFileStream *)(local_268 + 0x10))) {
                    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
                    psVar17 = extraout_RDX_15;
                  }
                  if (local_1e8 != &local_1d8) {
                    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
                    psVar17 = extraout_RDX_16;
                  }
                  if (local_190 != &local_180) {
                    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
                    psVar17 = extraout_RDX_17;
                  }
                  if (local_1c8 != &local_1b8) {
                    operator_delete(local_1c8,
                                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,
                                             local_1b8._M_local_buf[0]) + 1);
                    psVar17 = extraout_RDX_18;
                  }
                  psVar20 = psVar20 + 0xd;
                } while (psVar20 != local_90);
              }
            }
            else {
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_240[8];
              for (pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_240[7]; pbVar19 != pbVar6;
                  pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pbVar19[3]._M_string_length) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_170,pbVar19);
              }
            }
            goto LAB_00501dac;
          }
          plVar21 = local_240;
          if (plVar3 != plVar4) {
            local_310._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x7;
            local_310._8_8_ = "Source ";
            local_310._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)cVar12._M_node[4]._M_parent;
            local_310._24_8_ = cVar12._M_node[4]._M_left;
            local_2e8 = (string *)0x0;
            local_2e0 = (_Base_ptr)0xf;
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x8e6f8b;
            local_2d0 = (string *)0x0;
            local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar3;
            local_2c8 = (_Base_ptr)plVar3[1];
            local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_2b0 = (pointer)0x1d;
            local_2a8 = (pointer)0x8e704d;
            local_2a0 = 0;
            local_288 = 0;
            local_280 = 0x2a;
            local_278 = "` module but must be of type `CXX_MODULES`";
            local_270 = 0;
            views_01._M_len = 7;
            views_01._M_array = (iterator)local_310;
            local_298 = p_Var5;
            local_290 = __s1;
            cmCatViews((string *)local_370,views_01);
            cmSystemTools::Error((string *)local_370);
LAB_00501d88:
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
            }
            local_338 = (string *)((ulong)local_338 & 0xffffffff00000000);
          }
        }
LAB_00501dac:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        plVar21 = plVar21 + 0xd;
        uVar7 = local_1a8._M_allocated_capacity;
        uVar22 = local_1a8._8_8_;
        p_Var16 = local_120;
      } while (plVar21 != local_98);
    }
    for (; uVar23 = local_1a8._8_8_, local_120 = p_Var16, uVar7 != local_1a8._8_8_;
        uVar7 = (undefined8 *)(uVar7 + 0x10)) {
      local_1a8._8_8_ = uVar22;
      std::__ostream_insert<char,std::char_traits<char>>(*(ostream **)uVar7,")\n",2);
      uVar22 = local_1a8._8_8_;
      p_Var16 = local_120;
      local_1a8._8_8_ = uVar23;
    }
    local_1a8._8_8_ = uVar22;
    if (p_Var16 != (_Rb_tree_node_base *)(local_138 + 8)) {
      do {
        for (p_Var15 = p_Var16[2]._M_right; p_Var15 != (_Rb_tree_node_base *)&p_Var16[2]._M_parent;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          cVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_170,(key_type *)(p_Var15 + 1));
          if (cVar14._M_node != (_Base_ptr)local_168) {
            local_310._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1a;
            local_310._8_8_ = "Public C++ module source `";
            local_310._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_2f0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)(p_Var16 + 1);
            local_310._24_8_ = p_Var16[1]._M_parent;
            local_2e8 = (string *)0x0;
            local_2e0 = (_Base_ptr)0x10;
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x8e7304;
            local_2d0 = (string *)0x0;
            local_2c0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)(p_Var15 + 1);
            local_2c8 = p_Var15[1]._M_parent;
            local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_2b0 = (pointer)0x32;
            local_2a8 = (pointer)0x8e7315;
            local_2a0 = 0;
            views_07._M_len = 5;
            views_07._M_array = (iterator)local_310;
            cmCatViews((string *)local_370,views_07);
            cmSystemTools::Error((string *)local_370);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
            }
            local_338 = (string *)((ulong)local_338 & 0xffffffff00000000);
          }
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Rb_tree_node_base *)(local_138 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)(local_158 + 0x20));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_170);
    if (this_01 != (cmGeneratedFileStream *)0x0) {
      (*(this_01->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    std::
    vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ::~vector((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
               *)&local_1a8);
    bVar18 = (byte)local_338;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)(bVar18 & 1);
}

Assistant:

bool cmDyndepCollation::WriteDyndepMetadata(
  std::string const& lang, std::vector<cmScanDepInfo> const& objects,
  cmCxxModuleExportInfo const& export_info,
  cmDyndepMetadataCallbacks const& cb)
{
  // Only C++ supports any of the file-set or BMI installation considered
  // below.
  if (lang != "CXX"_s) {
    return true;
  }

  bool result = true;

  // Prepare the export information blocks.
  std::string const config_upper =
    cmSystemTools::UpperCase(export_info.Config);
  std::vector<
    std::pair<std::unique_ptr<cmGeneratedFileStream>, CxxModuleExport const*>>
    exports;
  for (auto const& exp : export_info.Exports) {
    std::unique_ptr<cmGeneratedFileStream> properties;

    std::string const export_dir =
      cmStrCat(exp.Prefix, '/', exp.CxxModuleInfoDir, '/');
    std::string const property_file_path = cmStrCat(
      export_dir, "target-", exp.Name, '-', export_info.Config, ".cmake");
    properties = cm::make_unique<cmGeneratedFileStream>(property_file_path);

    // Set up the preamble.
    *properties << "set_property(TARGET \"" << exp.Namespace << exp.Name
                << "\"\n"
                << "  PROPERTY IMPORTED_CXX_MODULES_" << config_upper << '\n';

    exports.emplace_back(std::move(properties), &exp);
  }

  std::unique_ptr<cmGeneratedFileStream> bmi_install_script;
  if (export_info.BmiInstallation) {
    bmi_install_script = cm::make_unique<cmGeneratedFileStream>(
      export_info.BmiInstallation->ScriptLocation);
  }

  auto cmEscape = [](cm::string_view str) {
    return cmOutputConverter::EscapeForCMake(
      str, cmOutputConverter::WrapQuotes::NoWrap);
  };
  auto install_destination =
    [&cmEscape](std::string const& dest) -> std::pair<bool, std::string> {
    if (cmSystemTools::FileIsFullPath(dest)) {
      return std::make_pair(true, cmEscape(dest));
    }
    return std::make_pair(false,
                          cmStrCat("${_IMPORT_PREFIX}/", cmEscape(dest)));
  };

  // public/private requirement tracking.
  std::set<std::string> private_modules;
  std::map<std::string, std::set<std::string>> public_source_requires;

  for (cmScanDepInfo const& object : objects) {
    // Convert to forward slashes.
    auto output_path = object.PrimaryOutput;
#ifdef _WIN32
    cmSystemTools::ConvertToUnixSlashes(output_path);
#endif
    // Find the fileset for this object.
    auto fileset_info_itr = export_info.ObjectToFileSet.find(output_path);
    bool const has_provides = !object.Provides.empty();
    if (fileset_info_itr == export_info.ObjectToFileSet.end()) {
      // If it provides anything, it should have type `CXX_MODULES`
      // and be present.
      if (has_provides) {
        // Take the first module provided to provide context.
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput, " provides the `",
                   provides.LogicalName,
                   "` module but it is not found in a `FILE_SET` of type "
                   "`CXX_MODULES`"));
        result = false;
      }

      // This object file does not provide anything, so nothing more needs to
      // be done.
      continue;
    }

    auto const& file_set = fileset_info_itr->second;

    // Verify the fileset type for the object.
    if (file_set.Type == "CXX_MODULES"_s) {
      if (!has_provides) {
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput,
                   " is of type `CXX_MODULES` but does not provide a module "
                   "interface unit or partition"));
        result = false;
        continue;
      }
    } else if (file_set.Type == "CXX_MODULE_HEADERS"_s) {
      // TODO.
    } else {
      if (has_provides) {
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(cmStrCat(
          "Source ", file_set.SourcePath, " provides the `",
          provides.LogicalName, "` C++ module but is of type `", file_set.Type,
          "` module but must be of type `CXX_MODULES`"));
        result = false;
      }

      // Not a C++ module; ignore.
      continue;
    }

    if (!cmFileSetVisibilityIsForInterface(file_set.Visibility)) {
      // Nothing needs to be conveyed about non-`PUBLIC` modules.
      for (auto const& p : object.Provides) {
        private_modules.insert(p.LogicalName);
      }
      continue;
    }

    // The module is public. Record what it directly requires.
    {
      auto& reqs = public_source_requires[file_set.SourcePath];
      for (auto const& r : object.Requires) {
        reqs.insert(r.LogicalName);
      }
    }

    // Write out properties and install rules for any exports.
    for (auto const& p : object.Provides) {
      bool bmi_dest_is_abs = false;
      std::string bmi_destination;
      if (export_info.BmiInstallation) {
        auto dest =
          install_destination(export_info.BmiInstallation->Destination);
        bmi_dest_is_abs = dest.first;
        bmi_destination = cmStrCat(dest.second, '/');
      }

      std::string install_bmi_path;
      std::string build_bmi_path;
      auto m = cb.ModuleFile(p.LogicalName);
      if (m) {
        install_bmi_path = cmStrCat(
          bmi_destination, cmEscape(cmSystemTools::GetFilenameName(*m)));
        build_bmi_path = cmEscape(*m);
      }

      for (auto const& exp : exports) {
        std::string iface_source;
        if (exp.second->Install && file_set.Destination) {
          auto dest = install_destination(*file_set.Destination);
          iface_source = cmStrCat(
            dest.second, '/', cmEscape(file_set.RelativeDirectory),
            cmEscape(cmSystemTools::GetFilenameName(file_set.SourcePath)));
        } else {
          iface_source = cmEscape(file_set.SourcePath);
        }

        std::string bmi_path;
        if (exp.second->Install && export_info.BmiInstallation) {
          bmi_path = install_bmi_path;
        } else if (!exp.second->Install) {
          bmi_path = build_bmi_path;
        }

        if (iface_source.empty()) {
          // No destination for the C++ module source; ignore this property
          // value.
          continue;
        }

        *exp.first << "    \"" << cmEscape(p.LogicalName) << '='
                   << iface_source;
        if (!bmi_path.empty()) {
          *exp.first << ',' << bmi_path;
        }
        *exp.first << "\"\n";
      }

      if (bmi_install_script) {
        auto const& bmi_install = *export_info.BmiInstallation;

        *bmi_install_script << "if (CMAKE_INSTALL_COMPONENT STREQUAL \""
                            << cmEscape(bmi_install.Component) << '\"';
        if (!bmi_install.ExcludeFromAll) {
          *bmi_install_script << " OR NOT CMAKE_INSTALL_COMPONENT";
        }
        *bmi_install_script << ")\n";
        *bmi_install_script << "  file(INSTALL\n"
                               "    DESTINATION \"";
        if (!bmi_dest_is_abs) {
          *bmi_install_script << "${CMAKE_INSTALL_PREFIX}/";
        }
        *bmi_install_script << cmEscape(bmi_install.Destination)
                            << "\"\n"
                               "    TYPE FILE\n";
        if (bmi_install.Optional) {
          *bmi_install_script << "    OPTIONAL\n";
        }
        if (!bmi_install.MessageLevel.empty()) {
          *bmi_install_script << "    " << bmi_install.MessageLevel << "\n";
        }
        if (!bmi_install.Permissions.empty()) {
          *bmi_install_script << "    PERMISSIONS" << bmi_install.Permissions
                              << "\n";
        }
        *bmi_install_script << "    FILES \"" << *m << "\")\n";
        if (bmi_dest_is_abs) {
          *bmi_install_script
            << "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n"
               "    \""
            << cmEscape(cmSystemTools::GetFilenameName(*m))
            << "\")\n"
               "  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(WARNING\n"
               "      \"ABSOLUTE path INSTALL DESTINATION : "
               "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n"
               "  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(FATAL_ERROR\n"
               "      \"ABSOLUTE path INSTALL DESTINATION forbidden (by "
               "caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n";
        }
        *bmi_install_script << "endif ()\n";
      }
    }
  }

  // Add trailing parenthesis for the `set_property` call.
  for (auto const& exp : exports) {
    *exp.first << ")\n";
  }

  // Check that public sources only require public modules.
  for (auto const& pub_reqs : public_source_requires) {
    for (auto const& req : pub_reqs.second) {
      if (private_modules.count(req)) {
        cmSystemTools::Error(cmStrCat(
          "Public C++ module source `", pub_reqs.first, "` requires the `",
          req, "` C++ module which is provided by a private source"));
        result = false;
      }
    }
  }

  return result;
}